

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPMuxError ChunkAssignData(WebPChunk *chunk,WebPData *data,int copy_data,uint32_t tag)

{
  WebPData *pWVar1;
  size_t sVar2;
  uint8_t *__dest;
  
  if ((tag == 0x58385056) || (tag == 0x4d494e41)) {
    copy_data = 1;
  }
  if (chunk != (WebPChunk *)0x0) {
    if (chunk->owner_ != 0) {
      WebPFree((chunk->data_).bytes);
    }
    (chunk->data_).size = 0;
    chunk->next_ = (WebPChunk *)0x0;
    chunk->tag_ = 0;
    chunk->owner_ = 0;
    (chunk->data_).bytes = (uint8_t *)0x0;
  }
  if (data != (WebPData *)0x0) {
    pWVar1 = &chunk->data_;
    if (copy_data == 0) {
      sVar2 = data->size;
      pWVar1->bytes = data->bytes;
      (chunk->data_).size = sVar2;
    }
    else {
      pWVar1->bytes = (uint8_t *)0x0;
      (chunk->data_).size = 0;
      if ((data->bytes != (uint8_t *)0x0) && (data->size != 0)) {
        __dest = (uint8_t *)WebPMalloc(data->size);
        pWVar1->bytes = __dest;
        if (__dest == (uint8_t *)0x0) {
          return WEBP_MUX_MEMORY_ERROR;
        }
        memcpy(__dest,data->bytes,data->size);
        (chunk->data_).size = data->size;
      }
      chunk->owner_ = 1;
    }
  }
  chunk->tag_ = tag;
  return WEBP_MUX_OK;
}

Assistant:

WebPMuxError ChunkAssignData(WebPChunk* chunk, const WebPData* const data,
                             int copy_data, uint32_t tag) {
  // For internally allocated chunks, always copy data & make it owner of data.
  if (tag == kChunks[IDX_VP8X].tag || tag == kChunks[IDX_ANIM].tag) {
    copy_data = 1;
  }

  ChunkRelease(chunk);

  if (data != NULL) {
    if (copy_data) {        // Copy data.
      if (!WebPDataCopy(data, &chunk->data_)) return WEBP_MUX_MEMORY_ERROR;
      chunk->owner_ = 1;    // Chunk is owner of data.
    } else {                // Don't copy data.
      chunk->data_ = *data;
    }
  }
  chunk->tag_ = tag;
  return WEBP_MUX_OK;
}